

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O0

int Fra_SmlCheckNonConstOutputs(Fra_Sml_t *p)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pObj_00;
  int local_24;
  int i;
  Aig_Obj_t *pObj;
  Fra_Sml_t *p_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Aig_ManCoNum(p->pAig);
    iVar2 = Aig_ManRegNum(p->pAig);
    if (iVar1 - iVar2 <= local_24) {
      return 0;
    }
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,local_24);
    iVar1 = Fra_SmlNodeIsZero(p,pObj_00);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  return 1;
}

Assistant:

int Fra_SmlCheckNonConstOutputs( Fra_Sml_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachPoSeq( p->pAig, pObj, i )
        if ( !Fra_SmlNodeIsZero(p, pObj) )
            return 1;
    return 0;
}